

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

AddPropertyCacheBucket * __thiscall
HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::FindOrInsertNew
          (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this,int value)

{
  int iVar1;
  NodeBase *pNVar2;
  bool bVar3;
  char cVar4;
  Type *pTVar5;
  Type *unaff_R12;
  uint depth;
  undefined1 local_50 [8];
  EditingIterator iter;
  
  local_50 = (undefined1  [8])(this->table + (ulong)(uint)value % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  depth = 1;
  iter.super_Iterator.list =
       (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)local_50;
  iter.last = (NodeBase *)this;
  do {
    bVar3 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)local_50);
    if (!bVar3) goto LAB_003f507c;
    pTVar5 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
             ::Data((Iterator *)local_50);
    iVar1 = pTVar5->value;
    if (iVar1 != value) {
      pTVar5 = unaff_R12;
    }
    if (iVar1 <= value) {
      unaff_R12 = pTVar5;
    }
    cVar4 = (iVar1 != value) * '\x02' + '\x01';
    if (value < iVar1) {
      cVar4 = '\0';
    }
    depth = depth + (value < iVar1);
  } while (cVar4 == '\0');
  if (cVar4 == '\x03') {
LAB_003f507c:
    pNVar2 = iter.last;
    unaff_R12 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::InsertNodeBefore
                          ((EditingIterator *)local_50,(ArenaAllocator *)(iter.last)->next);
    unaff_R12->value = value;
    if ((DictionaryStats *)pNVar2[3].next != (DictionaryStats *)0x0) {
      DictionaryStats::Insert((DictionaryStats *)pNVar2[3].next,depth);
    }
  }
  return &unaff_R12->element;
}

Assistant:

T * FindOrInsertNew(int value)
    {
        uint hash = this->Hash(value);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[hash], iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
        newBucket->value = value;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return &newBucket->element;
    }